

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int invokeValueDestructor(void *p,_func_void_void_ptr *xDel,sqlite3_context *pCtx)

{
  int iVar1;
  code *pcVar2;
  
  pcVar2 = xDel + 1;
  if ((code *)0x1 < pcVar2) {
    pcVar2 = (code *)(*xDel)(p);
  }
  if (pCtx != (sqlite3_context *)0x0) {
    pCtx->isError = 0x12;
    pCtx->fErrorOrAux = '\x01';
    iVar1 = sqlite3VdbeMemSetStr
                      (pCtx->pOut,"string or blob too big",-1,'\x01',(_func_void_void_ptr *)0x0);
    return iVar1;
  }
  return (int)pcVar2;
}

Assistant:

static int invokeValueDestructor(
  const void *p,             /* Value to destroy */
  void (*xDel)(void*),       /* The destructor */
  sqlite3_context *pCtx      /* Set a SQLITE_TOOBIG error if no NULL */
){
  assert( xDel!=SQLITE_DYNAMIC );
  if( xDel==0 ){
    /* noop */
  }else if( xDel==SQLITE_TRANSIENT ){
    /* noop */
  }else{
    xDel((void*)p);
  }
  if( pCtx ) sqlite3_result_error_toobig(pCtx);
  return SQLITE_TOOBIG;
}